

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::IdentityGeometryShaderCase::init
          (IdentityGeometryShaderCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  ContextType ctxType;
  int iVar2;
  deUint32 err;
  int extraout_EAX;
  RenderTarget *pRVar3;
  undefined4 extraout_var;
  NotSupportedError *pNVar5;
  long *plVar6;
  size_type *psVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ios_base *this_00;
  int local_250 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [8];
  _func_int **local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_130 [264];
  long lVar4;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar1) {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (((this->super_IdentityShaderCase).super_TestCase.m_context)->m_contextInfo,
                       "GL_EXT_tessellation_shader");
    if (bVar1) {
      bVar1 = glu::ContextInfo::isExtensionSupported
                        (((this->super_IdentityShaderCase).super_TestCase.m_context)->m_contextInfo,
                         "GL_EXT_geometry_shader");
      if (bVar1) goto LAB_015939ec;
    }
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1a8 = (undefined1  [8])local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "Test requires GL_EXT_tessellation_shader and GL_EXT_geometry_shader extensions","");
    tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)local_1a8);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
LAB_015939ec:
  pRVar3 = Context::getRenderTarget((this->super_IdentityShaderCase).super_TestCase.m_context);
  if (0x7f < pRVar3->m_width) {
    pRVar3 = Context::getRenderTarget((this->super_IdentityShaderCase).super_TestCase.m_context);
    if (0x7f < pRVar3->m_height) {
      local_1a8 = (undefined1  [8])
                  ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.
                  m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "Testing tessellating shader program output does not change when a passthrough geometry shader is attached.\n"
                 ,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 "Rendering two images, first with and second without a geometry shader. Expecting similar results.\n"
                 ,0x62);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"Using additive blending to detect overlap.\n",0x2b);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
      this_00 = local_130;
      std::ios_base::~ios_base(this_00);
      if (Functional::(anonymous_namespace)::IdentityGeometryShaderCase::init()::patchBufferData ==
          '\0') {
        _GLOBAL__N_1::IdentityGeometryShaderCase::init((EVP_PKEY_CTX *)this_00);
      }
      iVar2 = (*((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx->
                _vptr_RenderContext[3])();
      lVar4 = CONCAT44(extraout_var,iVar2);
      (**(code **)(lVar4 + 0x6c8))(1,&this->m_patchBuffer);
      (**(code **)(lVar4 + 0x40))(0x8892,this->m_patchBuffer);
      (**(code **)(lVar4 + 0x150))(0x8892,0x40,init::patchBufferData,0x88e4);
      err = (**(code **)(lVar4 + 0x800))();
      glu::checkError(err,"gen buffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                      ,0xd3);
      return extraout_EAX;
    }
  }
  pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_250[1] = 0x80;
  de::toString<int>(&local_228,local_250 + 1);
  std::operator+(&local_1e8,"Test requires ",&local_228);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  local_248._M_dataplus._M_p = (pointer)*plVar6;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_248._M_dataplus._M_p == psVar7) {
    local_248.field_2._M_allocated_capacity = *psVar7;
    local_248.field_2._8_8_ = plVar6[3];
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  }
  else {
    local_248.field_2._M_allocated_capacity = *psVar7;
  }
  local_248._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_250[0] = 0x80;
  de::toString<int>(&local_208,local_250);
  std::operator+(&local_1c8,&local_248,&local_208);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  local_1a8 = (undefined1  [8])*plVar6;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar6 + 2);
  if (local_1a8 == (undefined1  [8])paVar8) {
    local_198[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_198[0]._8_8_ = plVar6[3];
    local_1a8 = (undefined1  [8])local_198;
  }
  else {
    local_198[0]._0_8_ = paVar8->_M_allocated_capacity;
  }
  local_1a0 = (_func_int **)plVar6[1];
  *plVar6 = (long)paVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)local_1a8);
  __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void IdentityGeometryShaderCase::init (void)
{
	// Requirements
	const bool supportsES32		= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 &&
		(!m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader") ||
		 !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader")))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader and GL_EXT_geometry_shader extensions");

	if (m_context.getRenderTarget().getWidth() < RENDER_SIZE ||
		m_context.getRenderTarget().getHeight() < RENDER_SIZE)
		throw tcu::NotSupportedError("Test requires " + de::toString<int>(RENDER_SIZE) + "x" + de::toString<int>(RENDER_SIZE) + " or larger render target.");

	// Log

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing tessellating shader program output does not change when a passthrough geometry shader is attached.\n"
		<< "Rendering two images, first with and second without a geometry shader. Expecting similar results.\n"
		<< "Using additive blending to detect overlap.\n"
		<< tcu::TestLog::EndMessage;

	// Resources

	{
		static const tcu::Vec4 patchBufferData[4] =
		{
			tcu::Vec4( -0.9f, -0.9f, 0.0f, 1.0f ),
			tcu::Vec4( -0.9f,  0.9f, 0.0f, 1.0f ),
			tcu::Vec4(  0.9f, -0.9f, 0.0f, 1.0f ),
			tcu::Vec4(  0.9f,  0.9f, 0.0f, 1.0f ),
		};

		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.genBuffers(1, &m_patchBuffer);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_patchBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(patchBufferData), patchBufferData, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen buffer");
	}
}